

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneindex.cpp
# Opt level: O0

QList<QGraphicsItem_*> * __thiscall
QGraphicsSceneIndex::items
          (QGraphicsSceneIndex *this,QRectF *rect,ItemSelectionMode mode,SortOrder order,
          QTransform *deviceTransform)

{
  long lVar1;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  QTransform *in_RDI;
  long in_FS_OFFSET;
  QGraphicsSceneIndexPrivate *d;
  QList<QGraphicsItem_*> *itemList;
  QRectF exposeRect;
  ItemSelectionMode mode_00;
  QTransform *viewTransform;
  QList<QGraphicsItem_*> *items;
  QGraphicsSceneIndexIntersector intersect;
  QRectF *rect_00;
  QGraphicsSceneIndexPrivate *this_00;
  
  mode_00 = (ItemSelectionMode)((ulong)in_RSI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  viewTransform = in_RDI;
  d_func((QGraphicsSceneIndex *)0xa27030);
  items = (QList<QGraphicsItem_*> *)*in_RDX;
  intersect = (QGraphicsSceneIndexIntersector)in_RDX[1];
  rect_00 = (QRectF *)in_RDX[2];
  this_00 = (QGraphicsSceneIndexPrivate *)in_RDX[3];
  _q_adjustRect((QRectF *)0xa27097);
  ((DataPointer *)in_RDI->m_matrix)->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  ((DataPointer *)in_RDI->m_matrix)->ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  ((DataPointer *)in_RDI->m_matrix)->size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QGraphicsItem_*>::QList((QList<QGraphicsItem_*> *)0xa270c6);
  QGraphicsSceneIndexPrivate::items_helper
            (this_00,rect_00,intersect,items,viewTransform,mode_00,order,rect);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QList<QGraphicsItem_*> *)in_RDI;
}

Assistant:

QList<QGraphicsItem *> QGraphicsSceneIndex::items(const QRectF &rect, Qt::ItemSelectionMode mode,
                                                  Qt::SortOrder order, const QTransform &deviceTransform) const
{
    Q_D(const QGraphicsSceneIndex);
    QRectF exposeRect = rect;
    _q_adjustRect(&exposeRect);
    QList<QGraphicsItem *> itemList;
    d->items_helper(exposeRect, &QtPrivate::intersect_rect, &itemList, deviceTransform, mode, order, &rect);
    return itemList;
}